

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err uc_open(uc_arch arch,uc_mode mode,uc_engine **result)

{
  uc_engine *__ptr;
  code *pcVar1;
  
  if (UC_ARCH_TRICORE < arch) {
    return UC_ERR_ARCH;
  }
  __ptr = (uc_engine *)calloc(1,0x3a10);
  if (__ptr == (uc_engine *)0x0) {
    return UC_ERR_NOMEM;
  }
  __ptr->alloc_hint = 0x10;
  __ptr->errnum = UC_ERR_OK;
  __ptr->arch = arch;
  __ptr->mode = mode;
  __ptr->reg_read = default_reg_read;
  __ptr->reg_write = default_reg_write;
  (__ptr->ram_list).blocks.lh_first = (RAMBlock *)0x0;
  (__ptr->memory_listeners).tqh_first = (MemoryListener *)0x0;
  (__ptr->memory_listeners).tqh_circ.tql_prev = (QTailQLink *)&__ptr->memory_listeners;
  (__ptr->address_spaces).tqh_first = (AddressSpace *)0x0;
  (__ptr->address_spaces).tqh_circ.tql_prev = (QTailQLink *)&__ptr->address_spaces;
  switch(arch) {
  case UC_ARCH_ARM:
    if ((mode & ~(UC_MODE_BIG_ENDIAN|UC_MODE_ARMBE8|UC_MODE_ARM1176|UC_MODE_ARM946|UC_MODE_ARM926|
                  UC_MODE_MCLASS|UC_MODE_MICRO)) != UC_MODE_ARM) {
LAB_004d323d:
      free(__ptr);
      return UC_ERR_MODE;
    }
    __ptr->init_arch = uc_init_arm;
    if ((mode & UC_MODE_MICRO) != UC_MODE_ARM) {
      __ptr->thumb = 1;
    }
    goto switchD_004d30c2_default;
  case UC_ARCH_ARM64:
    if ((mode & ~(UC_MODE_BIG_ENDIAN|UC_MODE_ARMBE8|UC_MODE_ARM1176|UC_MODE_ARM946|UC_MODE_ARM926|
                  UC_MODE_MCLASS|UC_MODE_MICRO)) != UC_MODE_ARM) goto LAB_004d323d;
    pcVar1 = uc_init_aarch64;
    break;
  case UC_ARCH_MIPS:
    if ((mode & ~(UC_MODE_BIG_ENDIAN|UC_MODE_64|UC_MODE_32)) != UC_MODE_ARM ||
        (mode & (UC_MODE_64|UC_MODE_32)) == UC_MODE_ARM) goto LAB_004d323d;
    if (mode < UC_MODE_BIG_ENDIAN) {
      if ((mode & UC_MODE_32) != UC_MODE_ARM) {
        __ptr->init_arch = uc_init_mipsel;
      }
      if (mode < UC_MODE_64) goto switchD_004d30c2_default;
      pcVar1 = uc_init_mips64el;
    }
    else {
      if ((mode & UC_MODE_32) != UC_MODE_ARM) {
        __ptr->init_arch = uc_init_mips;
      }
      if ((mode & UC_MODE_64) == UC_MODE_ARM) goto switchD_004d30c2_default;
      pcVar1 = uc_init_mips64;
    }
    break;
  case UC_ARCH_X86:
    if (mode == UC_MODE_ARM || (mode & ~(UC_MODE_64|UC_MODE_32|UC_MODE_16)) != UC_MODE_ARM)
    goto LAB_004d323d;
    pcVar1 = uc_init_x86_64;
    break;
  case UC_ARCH_PPC:
    if ((mode & ~(UC_MODE_64|UC_MODE_32)) != UC_MODE_BIG_ENDIAN ||
        (mode & (UC_MODE_64|UC_MODE_32)) == UC_MODE_ARM) goto LAB_004d323d;
    if ((mode & UC_MODE_64) == UC_MODE_ARM) {
      pcVar1 = uc_init_ppc;
    }
    else {
      pcVar1 = uc_init_ppc64;
    }
    break;
  case UC_ARCH_SPARC:
    if ((mode & ~(UC_MODE_64|UC_MODE_32)) != UC_MODE_BIG_ENDIAN ||
        (mode & (UC_MODE_64|UC_MODE_32)) == UC_MODE_ARM) goto LAB_004d323d;
    if ((mode & UC_MODE_64) == UC_MODE_ARM) {
      pcVar1 = uc_init_sparc;
    }
    else {
      pcVar1 = uc_init_sparc64;
    }
    break;
  case UC_ARCH_M68K:
    if (mode != UC_MODE_BIG_ENDIAN) goto LAB_004d323d;
    pcVar1 = uc_init_m68k;
    break;
  case UC_ARCH_RISCV:
    if (mode == UC_MODE_ARM || (mode & ~(UC_MODE_64|UC_MODE_32)) != UC_MODE_ARM) goto LAB_004d323d;
    if ((mode & UC_MODE_32) == UC_MODE_ARM) {
      pcVar1 = uc_init_riscv64;
    }
    else {
      pcVar1 = uc_init_riscv32;
    }
    break;
  case UC_ARCH_S390X:
    if (mode != UC_MODE_BIG_ENDIAN) goto LAB_004d323d;
    pcVar1 = uc_init_s390x;
    break;
  case UC_ARCH_TRICORE:
    if (mode != UC_MODE_ARM) goto LAB_004d323d;
    pcVar1 = uc_init_tricore;
    break;
  default:
    goto switchD_004d30c2_default;
  }
  __ptr->init_arch = pcVar1;
switchD_004d30c2_default:
  if (__ptr->init_arch != (uc_args_uc_t)0x0) {
    __ptr->init_done = false;
    __ptr->cpu_model = 0x7fffffff;
    *result = __ptr;
    return UC_ERR_OK;
  }
  free(__ptr);
  return UC_ERR_ARCH;
}

Assistant:

UNICORN_EXPORT
uc_err uc_open(uc_arch arch, uc_mode mode, uc_engine **result)
{
    struct uc_struct *uc;

    if (arch < UC_ARCH_MAX) {
        uc = calloc(1, sizeof(*uc));
        if (!uc) {
            // memory insufficient
            return UC_ERR_NOMEM;
        }

        /* qemu/exec.c: phys_map_node_reserve() */
        uc->alloc_hint = 16;
        uc->errnum = UC_ERR_OK;
        uc->arch = arch;
        uc->mode = mode;
        uc->reg_read = default_reg_read;
        uc->reg_write = default_reg_write;

        // uc->ram_list = { .blocks = QLIST_HEAD_INITIALIZER(ram_list.blocks) };
        QLIST_INIT(&uc->ram_list.blocks);

        QTAILQ_INIT(&uc->memory_listeners);

        QTAILQ_INIT(&uc->address_spaces);

        switch (arch) {
        default:
            break;
#ifdef UNICORN_HAS_M68K
        case UC_ARCH_M68K:
            if ((mode & ~UC_MODE_M68K_MASK) || !(mode & UC_MODE_BIG_ENDIAN)) {
                free(uc);
                return UC_ERR_MODE;
            }
            uc->init_arch = uc_init_m68k;
            break;
#endif
#ifdef UNICORN_HAS_X86
        case UC_ARCH_X86:
            if ((mode & ~UC_MODE_X86_MASK) || (mode & UC_MODE_BIG_ENDIAN) ||
                !(mode & (UC_MODE_16 | UC_MODE_32 | UC_MODE_64))) {
                free(uc);
                return UC_ERR_MODE;
            }
            uc->init_arch = uc_init_x86_64;
            break;
#endif
#ifdef UNICORN_HAS_ARM
        case UC_ARCH_ARM:
            if ((mode & ~UC_MODE_ARM_MASK)) {
                free(uc);
                return UC_ERR_MODE;
            }
            uc->init_arch = uc_init_arm;

            if (mode & UC_MODE_THUMB) {
                uc->thumb = 1;
            }
            break;
#endif
#ifdef UNICORN_HAS_ARM64
        case UC_ARCH_ARM64:
            if (mode & ~UC_MODE_ARM_MASK) {
                free(uc);
                return UC_ERR_MODE;
            }
            uc->init_arch = uc_init_aarch64;
            break;
#endif

#if defined(UNICORN_HAS_MIPS) || defined(UNICORN_HAS_MIPSEL) ||                \
    defined(UNICORN_HAS_MIPS64) || defined(UNICORN_HAS_MIPS64EL)
        case UC_ARCH_MIPS:
            if ((mode & ~UC_MODE_MIPS_MASK) ||
                !(mode & (UC_MODE_MIPS32 | UC_MODE_MIPS64))) {
                free(uc);
                return UC_ERR_MODE;
            }
            if (mode & UC_MODE_BIG_ENDIAN) {
#ifdef UNICORN_HAS_MIPS
                if (mode & UC_MODE_MIPS32) {
                    uc->init_arch = uc_init_mips;
                }
#endif
#ifdef UNICORN_HAS_MIPS64
                if (mode & UC_MODE_MIPS64) {
                    uc->init_arch = uc_init_mips64;
                }
#endif
            } else { // little endian
#ifdef UNICORN_HAS_MIPSEL
                if (mode & UC_MODE_MIPS32) {
                    uc->init_arch = uc_init_mipsel;
                }
#endif
#ifdef UNICORN_HAS_MIPS64EL
                if (mode & UC_MODE_MIPS64) {
                    uc->init_arch = uc_init_mips64el;
                }
#endif
            }
            break;
#endif

#ifdef UNICORN_HAS_SPARC
        case UC_ARCH_SPARC:
            if ((mode & ~UC_MODE_SPARC_MASK) || !(mode & UC_MODE_BIG_ENDIAN) ||
                !(mode & (UC_MODE_SPARC32 | UC_MODE_SPARC64))) {
                free(uc);
                return UC_ERR_MODE;
            }
            if (mode & UC_MODE_SPARC64) {
                uc->init_arch = uc_init_sparc64;
            } else {
                uc->init_arch = uc_init_sparc;
            }
            break;
#endif
#ifdef UNICORN_HAS_PPC
        case UC_ARCH_PPC:
            if ((mode & ~UC_MODE_PPC_MASK) || !(mode & UC_MODE_BIG_ENDIAN) ||
                !(mode & (UC_MODE_PPC32 | UC_MODE_PPC64))) {
                free(uc);
                return UC_ERR_MODE;
            }
            if (mode & UC_MODE_PPC64) {
                uc->init_arch = uc_init_ppc64;
            } else {
                uc->init_arch = uc_init_ppc;
            }
            break;
#endif
#ifdef UNICORN_HAS_RISCV
        case UC_ARCH_RISCV:
            if ((mode & ~UC_MODE_RISCV_MASK) ||
                !(mode & (UC_MODE_RISCV32 | UC_MODE_RISCV64))) {
                free(uc);
                return UC_ERR_MODE;
            }
            if (mode & UC_MODE_RISCV32) {
                uc->init_arch = uc_init_riscv32;
            } else if (mode & UC_MODE_RISCV64) {
                uc->init_arch = uc_init_riscv64;
            } else {
                free(uc);
                return UC_ERR_MODE;
            }
            break;
#endif
#ifdef UNICORN_HAS_S390X
        case UC_ARCH_S390X:
            if ((mode & ~UC_MODE_S390X_MASK) || !(mode & UC_MODE_BIG_ENDIAN)) {
                free(uc);
                return UC_ERR_MODE;
            }
            uc->init_arch = uc_init_s390x;
            break;
#endif
#ifdef UNICORN_HAS_TRICORE
        case UC_ARCH_TRICORE:
            if ((mode & ~UC_MODE_TRICORE_MASK)) {
                free(uc);
                return UC_ERR_MODE;
            }
            uc->init_arch = uc_init_tricore;
            break;
#endif
        }

        if (uc->init_arch == NULL) {
            free(uc);
            return UC_ERR_ARCH;
        }

        uc->init_done = false;
        uc->cpu_model = INT_MAX; // INT_MAX means the default cpu model.

        *result = uc;

        return UC_ERR_OK;
    } else {
        return UC_ERR_ARCH;
    }
}